

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

pair<const_slang::ast::ClassType_*,_bool> __thiscall
slang::ast::resolveNewClassTarget
          (ast *this,NameSyntax *nameSyntax,ASTContext *context,Type **assignmentTarget,
          SourceRange range)

{
  Type *pTVar1;
  ClassType *pCVar2;
  Diagnostic *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  char *pcVar4;
  DiagCode code;
  size_t sVar5;
  Token TVar6;
  pair<const_slang::ast::ClassType_*,_bool> pVar7;
  SourceRange SVar8;
  SourceRange sourceRange;
  string_view arg;
  undefined8 uVar3;
  
  if (*(int *)this == 0x67) {
    pTVar1 = (Type *)(context->scope).ptr;
    if (pTVar1 != (Type *)0x0) {
      if (pTVar1->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar1);
      }
      if ((pTVar1->canonical->super_Symbol).kind == ClassType) {
        pTVar1 = (Type *)(context->scope).ptr;
        if (pTVar1->canonical == (Type *)0x0) {
          Type::resolveCanonical(pTVar1);
        }
        pCVar2 = (ClassType *)pTVar1->canonical;
        uVar3 = 0;
LAB_004c1fba:
        if ((char)uVar3 != '\0') goto LAB_004c2031;
        if (pCVar2->isAbstract == true) {
          code.subsystem = Expressions;
          code.code = 0x7d;
        }
        else {
          if (pCVar2->isInterface != true) goto LAB_004c2031;
          code.subsystem = Expressions;
          code.code = 0x7c;
        }
        SVar8.endLoc = range.startLoc;
        SVar8.startLoc = (SourceLocation)assignmentTarget;
        this_00 = ASTContext::addDiag((ASTContext *)nameSyntax,code,SVar8);
        sVar5 = (pCVar2->super_Type).super_Symbol.name._M_len;
        pcVar4 = (pCVar2->super_Type).super_Symbol.name._M_str;
LAB_004c2024:
        arg._M_str = pcVar4;
        arg._M_len = sVar5;
        Diagnostic::operator<<(this_00,arg);
        goto LAB_004c202f;
      }
    }
    pTVar1 = (Type *)(context->scope).ptr;
    if (pTVar1 != (Type *)0x0) {
      if (pTVar1->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar1);
      }
      if ((pTVar1->canonical->super_Symbol).kind == ErrorType) goto LAB_004c202f;
    }
    sourceRange.endLoc = range.startLoc;
    sourceRange.startLoc = (SourceLocation)assignmentTarget;
    ASTContext::addDiag((ASTContext *)nameSyntax,(DiagCode)0x7b0007,sourceRange);
  }
  else {
    TVar6 = slang::syntax::SyntaxNode::getLastToken(*(SyntaxNode **)(this + 0x18));
    if (TVar6.kind == SuperKeyword) {
      pVar7 = Lookup::getContainingClass
                        (*(Scope **)&(nameSyntax->super_ExpressionSyntax).super_SyntaxNode);
      uVar3 = pVar7._8_8_;
      pCVar2 = pVar7.first;
      if ((pCVar2 != (ClassType *)0x0) && ((pCVar2->super_Type).super_Symbol.name._M_len != 0)) {
        if ((pCVar2->super_Scope).deferredMemberIndex != Invalid) {
          Scope::elaborate(&pCVar2->super_Scope);
          uVar3 = extraout_RDX;
        }
        pTVar1 = pCVar2->baseClass;
        if (pTVar1 == (Type *)0x0) {
          SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this);
          this_00 = ASTContext::addDiag((ASTContext *)nameSyntax,(DiagCode)0x2f000a,SVar8);
          sVar5 = (pCVar2->super_Type).super_Symbol.name._M_len;
          pcVar4 = (pCVar2->super_Type).super_Symbol.name._M_str;
          goto LAB_004c2024;
        }
        if (pTVar1->canonical == (Type *)0x0) {
          Type::resolveCanonical(pTVar1);
          uVar3 = extraout_RDX_00;
        }
        if ((pTVar1->canonical->super_Symbol).kind != ErrorType) {
          pCVar2 = (ClassType *)pTVar1->canonical;
          (context->scope).ptr =
               *(Scope **)
                (**(long **)&(nameSyntax->super_ExpressionSyntax).super_SyntaxNode + 0x188);
          uVar3 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
          goto LAB_004c1fba;
        }
      }
    }
    else {
      pCVar2 = Lookup::findClass(*(NameSyntax **)(this + 0x18),(ASTContext *)nameSyntax,
                                 (optional<slang::DiagCode>)0x0);
      if (pCVar2 != (ClassType *)0x0) {
        (context->scope).ptr = (Scope *)pCVar2;
        uVar3 = 0;
        goto LAB_004c1fba;
      }
    }
  }
LAB_004c202f:
  pCVar2 = (ClassType *)0x0;
  uVar3 = 0;
LAB_004c2031:
  pVar7._8_8_ = uVar3;
  pVar7.first = pCVar2;
  return pVar7;
}

Assistant:

static std::pair<const ClassType*, bool> resolveNewClassTarget(const NameSyntax& nameSyntax,
                                                               const ASTContext& context,
                                                               const Type*& assignmentTarget,
                                                               SourceRange range) {
    // If the new expression is typed, look up that type as the target.
    // Otherwise, the target must come from the expression context.
    bool isSuperClass = false;
    const ClassType* classType = nullptr;
    if (nameSyntax.kind == SyntaxKind::ConstructorName) {
        if (!assignmentTarget || !assignmentTarget->isClass()) {
            if (!assignmentTarget || !assignmentTarget->isError())
                context.addDiag(diag::NewClassTarget, range);
            return {nullptr, false};
        }

        classType = &assignmentTarget->getCanonicalType().as<ClassType>();
    }
    else {
        auto& scoped = nameSyntax.as<ScopedNameSyntax>();
        if (scoped.left->getLastToken().kind == TokenKind::SuperKeyword) {
            // This is a super.new invocation, so find the base class's
            // constructor. This is relative to our current context, not
            // any particular assignment target.
            auto [ct, _] = Lookup::getContainingClass(*context.scope);
            classType = ct;
            if (!classType || classType->name.empty()) {
                // Parser already emitted an error for this case.
                return {nullptr, false};
            }

            auto base = classType->getBaseClass();
            if (!base) {
                context.addDiag(diag::SuperNoBase, nameSyntax.sourceRange()) << classType->name;
                return {nullptr, false};
            }

            if (base->isError())
                return {nullptr, false};

            classType = &base->as<Type>().getCanonicalType().as<ClassType>();
            assignmentTarget = &context.getCompilation().getVoidType();
            isSuperClass = true;
        }
        else {
            auto& className = *nameSyntax.as<ScopedNameSyntax>().left;
            classType = Lookup::findClass(className, context);
            if (!classType)
                return {nullptr, false};

            assignmentTarget = classType;
        }
    }

    if (!isSuperClass && classType->isAbstract) {
        context.addDiag(diag::NewVirtualClass, range) << classType->name;
        return {nullptr, false};
    }

    if (!isSuperClass && classType->isInterface) {
        context.addDiag(diag::NewInterfaceClass, range) << classType->name;
        return {nullptr, false};
    }

    return {classType, isSuperClass};
}